

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O1

uint32_t bcread_uleb128(LexState *ls)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  MSize MVar6;
  
  bVar3 = *ls->p;
  uVar2 = (uint)bVar3;
  pbVar4 = (byte *)(ls->p + 1);
  if ((char)bVar3 < '\0') {
    uVar2 = bVar3 & 0x7f;
    MVar6 = ls->n;
    bVar3 = 7;
    pbVar5 = pbVar4;
    do {
      MVar6 = MVar6 - 1;
      uVar2 = uVar2 | (*pbVar5 & 0x7f) << (bVar3 & 0x1f);
      ls->n = MVar6;
      pbVar4 = pbVar5 + 1;
      bVar3 = bVar3 + 7;
      bVar1 = *pbVar5;
      pbVar5 = pbVar4;
    } while ((char)bVar1 < '\0');
  }
  ls->n = ls->n - 1;
  ls->p = (char *)pbVar4;
  return uVar2;
}

Assistant:

static uint32_t bcread_uleb128(LexState *ls)
{
  const uint8_t *p = (const uint8_t *)ls->p;
  uint32_t v = *p++;
  if (LJ_UNLIKELY(v >= 0x80)) {
    int sh = 0;
    v &= 0x7f;
    do {
     v |= ((*p & 0x7f) << (sh += 7));
     bcread_dec(ls);
   } while (*p++ >= 0x80);
  }
  bcread_dec(ls);
  ls->p = (char *)p;
  return v;
}